

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsimplifier.h
# Opt level: O0

void __thiscall
soplex::SPxSimplifier<double>::SPxSimplifier(SPxSimplifier<double> *this,char *p_name,TYPE ttype)

{
  Timer *pTVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  TYPE in_stack_ffffffffffffffe4;
  
  *in_RDI = &PTR__SPxSimplifier_008971c0;
  in_RDI[1] = in_RSI;
  in_RDI[2] = 0;
  *(undefined4 *)(in_RDI + 3) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0;
  *(undefined4 *)(in_RDI + 6) = 0;
  *(undefined4 *)((long)in_RDI + 0x34) = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0x3f1a36e2eb1c432d;
  in_RDI[9] = 0;
  std::shared_ptr<soplex::Tolerances>::shared_ptr((shared_ptr<soplex::Tolerances> *)0x263ddb);
  pTVar1 = TimerFactory::createTimer(in_stack_ffffffffffffffe4);
  in_RDI[2] = pTVar1;
  return;
}

Assistant:

explicit SPxSimplifier(const char* p_name, Timer::TYPE ttype = Timer::USER_TIME)
      : m_name(p_name)
      , m_timeUsed(nullptr)
      , m_timerType(ttype)
      , m_remRows(0)
      , m_remCols(0)
      , m_remNzos(0)
      , m_chgBnds(0)
      , m_chgLRhs(0)
      , m_keptBnds(0)
      , m_keptLRhs(0)
      , m_objoffset(0.0)
      , m_minReduction(1e-4)
      , spxout(nullptr)
   {
      assert(isConsistent());

      m_timeUsed = TimerFactory::createTimer(ttype);
   }